

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

bool __thiscall Database::BeginTransaction(Database *this)

{
  Database_Result local_70;
  Database_Result local_50;
  undefined4 local_1c;
  Database *pDStack_18;
  int attempt;
  Database *this_local;
  
  if ((this->in_transaction & 1U) == 0) {
    local_1c = 1;
    pDStack_18 = this;
    if (this->engine == MySQL) {
      RawQuery(&local_50,this,"START TRANSACTION",true);
      Database_Result::~Database_Result(&local_50);
    }
    else if (this->engine == SQLite) {
      RawQuery(&local_70,this,"BEGIN",true);
      Database_Result::~Database_Result(&local_70);
    }
    this->in_transaction = true;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Database::BeginTransaction()
{
	if (this->in_transaction)
		return false;

	for (int attempt = 1; ; ++attempt)
	{
		try
		{
			if (attempt > 1)
			{
				Console::Wrn("Start transaction failed. Trying again... (Attempt %i / 10)", attempt);
				util::sleep(1.0 * attempt);
			}

			switch (this->engine)
			{
#ifdef DATABASE_MYSQL
				case MySQL:
					this->RawQuery("START TRANSACTION", true);
					break;
#endif // DATABASE_MYSQL

#ifdef DATABASE_SQLITE
				case SQLite:
					this->RawQuery("BEGIN", true);
					break;
#endif // DATABASE_SQLITE
			}

			break;
		}
		catch (...)
		{
			if (attempt >= 10)
			{
				Console::Err("Failed to begin transaction. Halting server.");
				std::terminate();
			}
		}
	}

	this->in_transaction = true;

	return true;
}